

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O0

int recip_estimate(int input)

{
  int iVar1;
  int r;
  int b;
  int a;
  int input_local;
  
  if ((input < 0x100) || (0x1ff < input)) {
    __assert_fail("256 <= input && input < 512",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/vfp_helper.c"
                  ,0x283,"int recip_estimate(int)");
  }
  iVar1 = (int)(0x80000 / (long)(input * 2 + 1)) + 1 >> 1;
  if ((0xff < iVar1) && (iVar1 < 0x200)) {
    return iVar1;
  }
  __assert_fail("256 <= r && r < 512",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/vfp_helper.c"
                ,0x287,"int recip_estimate(int)");
}

Assistant:

static int recip_estimate(int input)
{
    int a, b, r;
    assert(256 <= input && input < 512);
    a = (input * 2) + 1;
    b = (1 << 19) / a;
    r = (b + 1) >> 1;
    assert(256 <= r && r < 512);
    return r;
}